

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O1

JavascriptString * __thiscall Js::RuntimeFunction::EnsureSourceString(RuntimeFunction *this)

{
  Var pvVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  JavascriptString *pJVar6;
  DynamicTypeHandler *pDVar7;
  undefined4 *puVar8;
  PropertyString *name;
  ScriptContext *pSVar9;
  Type *addr;
  ulong uVar10;
  JavascriptString *local_48;
  JavascriptString *functionName;
  Type *local_38;
  
  pvVar1 = (this->functionNameId).ptr;
  if (this->isDisplayString == true) {
    pJVar6 = VarTo<Js::JavascriptString>(pvVar1);
    return pJVar6;
  }
  pJVar2 = (((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.ptr)->
           javascriptLibrary).ptr;
  addr = &this->functionNameId;
  if (pvVar1 == (Var)0x0) {
    pJVar6 = StringCache::GetFunctionDisplay(&pJVar2->stringCache);
  }
  else {
    pSVar9 = (pJVar2->super_JavascriptLibraryBase).scriptContext.ptr;
    pDVar7 = DynamicObject::GetTypeHandler((DynamicObject *)this);
    iVar5 = (*pDVar7->_vptr_DynamicTypeHandler[0x4d])(pDVar7);
    if (iVar5 != 0) {
      local_48 = (JavascriptString *)0x0;
      bVar4 = JavascriptFunction::GetFunctionName(&this->super_JavascriptFunction,&local_48);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                    ,0x2a,"(status)","status");
        if (!bVar4) goto LAB_00d56975;
        *puVar8 = 0;
      }
      (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
                (this,0x106,local_48,2,0,0,0xf);
    }
    uVar10 = (ulong)addr->ptr & 0xffff000000000000;
    functionName = (JavascriptString *)pSVar9;
    local_38 = addr;
    if (((ulong)addr->ptr & 0x1ffff00000000) != 0x1000000000000 && uVar10 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00d56975;
      *puVar8 = 0;
    }
    pvVar1 = local_38->ptr;
    if (uVar10 == 0x1000000000000) {
      if (((ulong)pvVar1 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar1 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar4) goto LAB_00d56975;
        *puVar8 = 0;
      }
      if (((ulong)pvVar1 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
        if (!bVar4) {
LAB_00d56975:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      pSVar9 = (ScriptContext *)functionName;
      name = ScriptContext::GetPropertyString((ScriptContext *)functionName,(PropertyId)pvVar1);
    }
    else {
      name = (PropertyString *)VarTo<Js::JavascriptString>(pvVar1);
      pSVar9 = (ScriptContext *)functionName;
    }
    pJVar6 = JavascriptFunction::GetNativeFunctionDisplayString
                       (pSVar9,&name->super_JavascriptString);
    addr = local_38;
  }
  Memory::Recycler::WBSetBit((char *)addr);
  (this->functionNameId).ptr = pJVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  this->isDisplayString = true;
  return pJVar6;
}

Assistant:

JavascriptString *
    RuntimeFunction::EnsureSourceString()
    {
        JavascriptLibrary* library = this->GetLibrary();
        ScriptContext * scriptContext = library->GetScriptContext();
        JavascriptString * retStr = nullptr;
        if (this->isDisplayString)
        {
            return VarTo<JavascriptString>(this->functionNameId);
        }

        if (this->functionNameId == nullptr)
        {
            retStr = library->GetFunctionDisplayString();
        }
        else
        {
            if (this->GetTypeHandler()->IsDeferredTypeHandler())
            {
                JavascriptString* functionName = nullptr;
                DebugOnly(bool status = ) this->GetFunctionName(&functionName);
                Assert(status);
                this->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
            if (TaggedInt::Is(this->functionNameId))
            {
                // This has a side-effect where any other code (such as debugger) that uses functionNameId value will now get the value like "function foo() { native code }"
                // instead of just "foo". Alternative ways will need to be devised; if it's not desirable to use this full display name value in those cases.
                retStr = GetNativeFunctionDisplayString(scriptContext, scriptContext->GetPropertyString(TaggedInt::ToInt32(this->functionNameId)));
            }
            else
            {
                retStr = GetNativeFunctionDisplayString(scriptContext, VarTo<JavascriptString>(this->functionNameId));
            }
        }

        this->functionNameId = retStr;
        this->isDisplayString = true;

        return retStr;
    }